

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O1

ma_result ma_spatializer_listener_get_heap_size
                    (ma_spatializer_listener_config *pConfig,size_t *pHeapSizeInBytes)

{
  bool bVar1;
  ma_result mVar2;
  size_t sVar3;
  
  if (pHeapSizeInBytes != (size_t *)0x0) {
    *pHeapSizeInBytes = 0;
    mVar2 = MA_INVALID_ARGS;
    if ((pConfig == (ma_spatializer_listener_config *)0x0) || ((ulong)pConfig->channelsOut == 0)) {
      sVar3 = 0;
      bVar1 = false;
    }
    else {
      sVar3 = (ulong)pConfig->channelsOut + 7 & 0xfffffffffffffff8;
      bVar1 = true;
      mVar2 = MA_SUCCESS;
    }
    if (bVar1) {
      *pHeapSizeInBytes = sVar3;
      mVar2 = MA_SUCCESS;
    }
    return mVar2;
  }
  return MA_INVALID_ARGS;
}

Assistant:

MA_API ma_result ma_spatializer_listener_get_heap_size(const ma_spatializer_listener_config* pConfig, size_t* pHeapSizeInBytes)
{
    ma_result result;
    ma_spatializer_listener_heap_layout heapLayout;

    if (pHeapSizeInBytes == NULL) {
        return MA_INVALID_ARGS;
    }

    *pHeapSizeInBytes = 0;

    result = ma_spatializer_listener_get_heap_layout(pConfig, &heapLayout);
    if (result != MA_SUCCESS) {
        return result;
    }

    *pHeapSizeInBytes = heapLayout.sizeInBytes;

    return MA_SUCCESS;
}